

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__gif_info_raw(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  undefined1 local_4888 [8];
  stbi__gif g;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  g._18512_8_ = comp;
  iVar1 = stbi__gif_header(s,(stbi__gif *)local_4888,comp,1);
  if (iVar1 == 0) {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  else {
    if (x != (int *)0x0) {
      *x = local_4888._0_4_;
    }
    if (y != (int *)0x0) {
      *y = local_4888._4_4_;
    }
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__gif_info_raw(stbi__context *s, int *x, int *y, int *comp)
{
   stbi__gif g;
   if (!stbi__gif_header(s, &g, comp, 1)) {
      stbi__rewind( s );
      return 0;
   }
   if (x) *x = g.w;
   if (y) *y = g.h;
   return 1;
}